

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_mthd.h
# Opt level: O2

void __thiscall
hwtest::pgraph::MthdVtxXy::MthdVtxXy
          (MthdVtxXy *this,TestOptions *opt,uint32_t seed,string *name,int trapbit,uint32_t cls,
          uint32_t mthd,uint32_t num,uint32_t stride,int flags)

{
  pgraph::SingleMthdTest::SingleMthdTest
            (&this->super_SingleMthdTest,opt,seed,name,trapbit,cls,mthd,num,stride);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_0030ddd8;
  this->first = (bool)((byte)flags & 1);
  this->poly = (bool)((byte)flags >> 1 & 1);
  this->draw = (bool)((byte)flags >> 2 & 1);
  this->fract = (bool)((byte)flags >> 3 & 1);
  this->noclip = (bool)((byte)flags >> 4 & 1);
  this->ifc = (bool)((byte)flags >> 5 & 1);
  this->check = (bool)((byte)flags >> 6 & 1);
  this->tfc = (bool)((byte)flags >> 7);
  return;
}

Assistant:

MthdVtxXy(hwtest::TestOptions &opt, uint32_t seed, const std::string &name, int trapbit, uint32_t cls, uint32_t mthd, uint32_t num, uint32_t stride, int flags)
	: SingleMthdTest(opt, seed, name, trapbit, cls, mthd, num, stride) {
		first = !!(flags & VTX_FIRST);
		poly = !!(flags & VTX_POLY);
		draw = !!(flags & VTX_DRAW);
		fract = !!(flags & VTX_FRACT);
		noclip = !!(flags & VTX_NOCLIP);
		ifc = !!(flags & VTX_IFC);
		check = !!(flags & VTX_CHECK);
		tfc = !!(flags & VTX_TFC);
	}